

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O0

void __thiscall
fizplex::Base::Base(Base *this,LP *lp,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *basic_indices)

{
  pointer pNVar1;
  size_type sVar2;
  size_t sVar3;
  type puVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  ETM *in_RDI;
  size_t i_1;
  size_t i;
  value_type *in_stack_ffffffffffffff48;
  ColMatrix *in_stack_ffffffffffffff50;
  SVector *in_stack_ffffffffffffff58;
  ETM *this_00;
  size_t in_stack_ffffffffffffff68;
  pointer local_58;
  Base *in_stack_ffffffffffffffc0;
  pointer local_30;
  
  std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::vector
            ((vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *)0x1e34f9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
  DVector::DVector((DVector *)in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
  pNVar1 = (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
  in_RDI[1].eta.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pNVar1;
  std::make_unique<unsigned_long[]>(in_stack_ffffffffffffff68);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
  sVar3 = LP::row_count((LP *)0x1e3572);
  if (sVar2 == sVar3) {
    for (local_30 = (pointer)0x0;
        local_30 <
        in_RDI[1].eta.values.
        super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_30 = (pointer)((long)&local_30->index + 1)) {
      this_00 = in_RDI;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (in_RDX,(size_type)local_30);
      ColMatrix::column(in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
      ETM::ETM(this_00,in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
      std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::push_back
                ((vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_> *)
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      ETM::~ETM((ETM *)0x1e368b);
    }
    for (local_58 = (pointer)0x0;
        local_58 <
        in_RDI[1].eta.values.
        super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_58 = (pointer)((long)&local_58->index + 1)) {
      pNVar1 = local_58;
      puVar4 = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator[]
                         ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                          local_58,(size_t)in_stack_ffffffffffffff48);
      *puVar4 = (unsigned_long)pNVar1;
    }
    invert(in_stack_ffffffffffffffc0);
    return;
  }
  __assert_fail("basic_indices.size() == lp.row_count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base.cc"
                ,0x13,"fizplex::Base::Base(const LP &, const std::vector<size_t> &)");
}

Assistant:

Base::Base(const LP &lp, const std::vector<size_t> &basic_indices)
    : work(basic_indices.size()), m(basic_indices.size()),
      row_ordering(std::make_unique<size_t[]>(m)) {
  assert(basic_indices.size() == lp.row_count());
  for (size_t i = 0; i < m; i++)
    etms.push_back(ETM(lp.A.column(basic_indices[i]), i));
  for (size_t i = 0; i < m; i++)
    row_ordering[i] = i;
  invert();
}